

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

int __thiscall
Centaurus::ATNMachine<unsigned_char>::count_incoming_edges
          (ATNMachine<unsigned_char> *this,int index,int *where)

{
  pointer pAVar1;
  pointer pAVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ATNTransition<unsigned_char> *t;
  pointer pAVar6;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_nodes).
                super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar4 == 0) {
    iVar3 = 0;
  }
  else {
    lVar4 = (lVar4 >> 3) * -0x79435e50d79435e5;
    lVar5 = 0;
    iVar3 = 0;
    do {
      pAVar2 = *(pointer *)
                ((long)&pAVar1[lVar5].m_transitions.
                        super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                        ._M_impl + 8);
      for (pAVar6 = *(pointer *)
                     &pAVar1[lVar5].m_transitions.
                      super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                      ._M_impl; pAVar6 != pAVar2; pAVar6 = pAVar6 + 1) {
        if (pAVar6->m_dest == index) {
          *where = (int)lVar5;
          iVar3 = iVar3 + 1;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4 + (ulong)(lVar4 == 0));
  }
  if (iVar3 != 1) {
    *where = -1;
  }
  return iVar3;
}

Assistant:

int count_incoming_edges(int index, int& where) const
    {
        int count = 0;
        for (int i = 0; i < m_nodes.size(); i++)
        {
            for (const auto& t : m_nodes.at(i).get_transitions())
            {
                if (t.dest() == index)
                {
                    where = i;
                    count++;
                    //break;  //Overlapping edges should be counted as one.
                }
            }
        }
        if (count != 1) where = -1;
        return count;
    }